

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUse
          (DefUseManager *this,Instruction *def,
          function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *f)

{
  undefined8 *puVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  bool bVar11;
  uint local_54;
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Any_data *local_40;
  Instruction *local_38;
  
  if (def != (Instruction *)0x0) {
    if (def->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
      pIVar4 = GetDef(this,uVar3);
      if (pIVar4 != def) goto LAB_001fa6b2;
    }
    bVar11 = true;
    if (def->has_result_id_ != false) {
      local_48 = &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_40 = (_Any_data *)f;
      local_50 = (_Base_ptr)UsersBegin(this,def);
      while( true ) {
        if (local_50 == local_48) {
          bVar11 = false;
        }
        else {
          bVar11 = *(Instruction **)(local_50 + 1) == def;
        }
        if (!bVar11) break;
        pIVar4 = (Instruction *)local_50[1]._M_parent;
        lVar9 = (long)(pIVar4->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(pIVar4->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4) *
                -0x5555555555555555;
        if ((int)uVar5 != 0) {
          uVar8 = 0;
          do {
            uVar7 = (uint)uVar8;
            if (uVar5 <= uVar8) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
            }
            lVar6 = uVar8 * 0x30;
            if (*(spv_operand_type_t *)(lVar9 + lVar6) != SPV_OPERAND_TYPE_RESULT_ID) {
              bVar2 = spvIsIdType(*(spv_operand_type_t *)(lVar9 + lVar6));
              if (bVar2) {
                uVar3 = 0;
                if (def->has_result_id_ == true) {
                  uVar3 = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
                }
                puVar1 = *(undefined8 **)(lVar9 + lVar6 + 0x28);
                puVar10 = (undefined8 *)(lVar9 + lVar6 + 0x20);
                if (puVar1 != (undefined8 *)0x0) {
                  puVar10 = puVar1;
                }
                if (uVar3 == *(uint32_t *)*puVar10) {
                  local_54 = uVar7;
                  local_38 = pIVar4;
                  if (*(long *)(local_40 + 1) == 0) {
                    std::__throw_bad_function_call();
                  }
                  bVar2 = (**(code **)(local_40->_M_pod_data + 0x18))(local_40,&local_38,&local_54);
                  if (!bVar2) goto LAB_001fa67a;
                }
              }
            }
            uVar8 = (ulong)(uVar7 + 1);
            lVar9 = (long)(pIVar4->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(pIVar4->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4) *
                    -0x5555555555555555;
          } while (uVar7 + 1 != (uint)uVar5);
        }
        local_50 = (_Base_ptr)std::_Rb_tree_increment(local_50);
      }
LAB_001fa67a:
      bVar11 = (bool)(bVar11 ^ 1);
    }
    return bVar11;
  }
LAB_001fa6b2:
  __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/def_use_manager.cpp"
                ,0x97,
                "bool spvtools::opt::analysis::DefUseManager::WhileEachUse(const Instruction *, const std::function<bool (Instruction *, uint32_t)> &) const"
               );
}

Assistant:

bool DefUseManager::WhileEachUse(
    const Instruction* def,
    const std::function<bool(Instruction*, uint32_t)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    Instruction* user = iter->user;
    for (uint32_t idx = 0; idx != user->NumOperands(); ++idx) {
      const Operand& op = user->GetOperand(idx);
      if (op.type != SPV_OPERAND_TYPE_RESULT_ID && spvIsIdType(op.type)) {
        if (def->result_id() == op.words[0]) {
          if (!f(user, idx)) return false;
        }
      }
    }
  }
  return true;
}